

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerManager.cpp
# Opt level: O3

void __thiscall TimerManager::~TimerManager(TimerManager *this)

{
  Timer *this_00;
  Timer **p;
  ulong uVar1;
  
  this_00 = (this->mDefaultTimer).mObj;
  if (this_00 != (Timer *)0x0) {
    RefCount::Release(&this_00->super_RefCount);
  }
  (this->mDefaultTimer).mObj = (Timer *)0x0;
  if ((this->mTimers).mSize != 0) {
    uVar1 = 0;
    do {
      jh_log_print(2,"TimerManager::~TimerManager()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/TimerManager.cpp"
                   ,0x51,"Possibly leaked Timer %p\n",(this->mTimers).mData[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < (this->mTimers).mSize);
  }
  Mutex::~Mutex(&this->mMutex);
  p = (this->mTimers).mData;
  if (p != (Timer **)0x0) {
    (this->mTimers).mSize = 0;
    operator_delete__(p);
    (this->mTimers).mData = (Timer **)0x0;
  }
  SmartPtr<Timer>::~SmartPtr(&this->mDefaultTimer);
  return;
}

Assistant:

TimerManager::~TimerManager()
{
	TRACE_BEGIN(LOG_LVL_NOTICE);
	
	// Release reference to default timer
	mDefaultTimer = NULL;
	
	// At this point all outstanding timers should be
	// gone.  If we still have a timer in our list then
	// log a warning but do not do anything to the memory
	for (unsigned i = 0; i < mTimers.size(); ++i)
	{
		LOG_WARN("Possibly leaked Timer %p\n", mTimers[i]);
	}
}